

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O3

void png_init_read_transformations(png_structrp png_ptr)

{
  png_uint_16 *ppVar1;
  byte *pbVar2;
  png_byte pVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  png_colorp ppVar8;
  png_bytep ppVar9;
  png_bytep ppVar10;
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  bool bVar13;
  undefined1 auVar14 [14];
  undefined1 uVar15;
  png_uint_16 pVar16;
  uint uVar17;
  byte bVar18;
  byte bVar19;
  png_uint_16 pVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  png_fixed_point pVar24;
  png_fixed_point pVar25;
  png_uint_16 pVar26;
  ushort uVar27;
  int i_1;
  png_byte *ppVar28;
  int i;
  ulong uVar29;
  png_fixed_point a;
  ulong uVar30;
  long lVar31;
  byte bVar32;
  png_bytep ppVar33;
  undefined1 auVar34 [16];
  undefined8 uVar35;
  undefined1 auVar36 [16];
  png_fixed_point gtest;
  byte local_3a;
  byte local_39;
  uint local_38;
  png_fixed_point local_34;
  
  pVar25 = png_ptr->screen_gamma;
  iVar21 = (png_ptr->colorspace).gamma;
  if (iVar21 == 0) {
    if (pVar25 == 0) {
      pVar25 = 100000;
      (png_ptr->colorspace).gamma = 100000;
      goto LAB_00114700;
    }
    pVar25 = png_reciprocal(pVar25);
    (png_ptr->colorspace).gamma = pVar25;
LAB_00114706:
    ppVar1 = &(png_ptr->colorspace).flags;
    *(byte *)ppVar1 = (byte)*ppVar1 | 1;
LAB_0011470d:
    uVar22 = png_ptr->transformations & 0xffffdfff;
  }
  else {
    if (pVar25 == 0) {
      pVar25 = png_reciprocal(iVar21);
LAB_00114700:
      png_ptr->screen_gamma = pVar25;
      goto LAB_00114706;
    }
    iVar21 = png_muldiv(&local_34,iVar21,pVar25,100000);
    if (iVar21 != 0) {
      iVar21 = png_gamma_significant(local_34);
      ppVar1 = &(png_ptr->colorspace).flags;
      *(byte *)ppVar1 = (byte)*ppVar1 | 1;
      if (iVar21 != 0) goto LAB_001146e8;
      goto LAB_0011470d;
    }
    ppVar1 = &(png_ptr->colorspace).flags;
    *(byte *)ppVar1 = (byte)*ppVar1 | 1;
LAB_001146e8:
    uVar22 = png_ptr->transformations | 0x2000;
  }
  png_ptr->transformations = uVar22;
  if ((uVar22 & 0x40080) == 0x40000) {
    png_ptr->transformations = uVar22 & 0xfd7ffe7f;
    pbVar2 = (byte *)((long)&png_ptr->flags + 1);
    *pbVar2 = *pbVar2 & 0xdf;
    png_ptr->num_trans = 0;
  }
  iVar21 = png_gamma_significant(png_ptr->screen_gamma);
  uVar22 = png_ptr->transformations;
  if (iVar21 == 0) {
    uVar22 = uVar22 & 0xff7fffff;
    png_ptr->transformations = uVar22;
    pbVar2 = (byte *)((long)&png_ptr->flags + 1);
    *pbVar2 = *pbVar2 & 0xdf;
  }
  if ((uVar22 & 0x600000) != 0) {
    png_colorspace_set_rgb_coefficients(png_ptr);
    uVar22 = png_ptr->transformations;
  }
  if ((uVar22 >> 8 & 1) == 0) {
    if ((((~uVar22 & 0x4080) == 0) &&
        (pVar20 = (png_ptr->background).red, pVar20 == (png_ptr->background).green)) &&
       (pVar20 == (png_ptr->background).blue)) {
      pbVar2 = (byte *)((long)&png_ptr->mode + 1);
      *pbVar2 = *pbVar2 | 8;
      (png_ptr->background).gray = pVar20;
    }
  }
  else if ((png_ptr->color_type & 2) == 0) {
    pbVar2 = (byte *)((long)&png_ptr->mode + 1);
    *pbVar2 = *pbVar2 | 8;
  }
  bVar18 = png_ptr->color_type;
  if (bVar18 == 3) {
    uVar30 = (ulong)png_ptr->num_trans;
    if (uVar30 == 0) {
      pbVar2 = (byte *)((long)&png_ptr->flags + 1);
      *pbVar2 = *pbVar2 & 0xdf;
LAB_001148d3:
      uVar22 = uVar22 & 0xff7ffe7f;
      png_ptr->transformations = uVar22;
    }
    else {
      uVar29 = 0;
      bVar13 = false;
      do {
        if (png_ptr->trans_alpha[uVar29] != 0xff) {
          if (png_ptr->trans_alpha[uVar29] != '\0') goto LAB_001148df;
          bVar13 = true;
        }
        uVar29 = uVar29 + 1;
      } while (uVar30 != uVar29);
      pbVar2 = (byte *)((long)&png_ptr->flags + 1);
      *pbVar2 = *pbVar2 & 0xdf;
      uVar22 = uVar22 & 0xff7fffff;
      png_ptr->transformations = uVar22;
      if (!bVar13) goto LAB_001148d3;
    }
LAB_001148df:
    if ((~uVar22 & 0x1100) == 0) {
      ppVar8 = png_ptr->palette;
      bVar18 = (png_ptr->background).index;
      (png_ptr->background).red = (ushort)ppVar8[bVar18].red;
      (png_ptr->background).green = (ushort)ppVar8[bVar18].green;
      (png_ptr->background).blue = (ushort)ppVar8[bVar18].blue;
      if ((uVar30 != 0) && ((uVar22 & 0x2080000) == 0x80000)) {
        ppVar9 = png_ptr->trans_alpha;
        uVar29 = 0;
        do {
          ppVar9[uVar29] = ~ppVar9[uVar29];
          uVar29 = uVar29 + 1;
        } while (uVar30 != uVar29);
        uVar22 = png_ptr->transformations;
      }
    }
  }
  else {
    uVar17 = uVar22;
    if ((bVar18 & 4) == 0) {
      pbVar2 = (byte *)((long)&png_ptr->flags + 1);
      *pbVar2 = *pbVar2 & 0xdf;
      png_ptr->transformations = uVar22 & 0xff7fffff;
      uVar17 = uVar22 & 0xff7fffff;
      if (png_ptr->num_trans == 0) {
        png_ptr->transformations = uVar22 & 0xff7ffe7f;
        uVar17 = uVar22 & 0xff7ffe7f;
      }
    }
    uVar22 = uVar17;
    if (((bVar18 & 2) == 0) && ((uVar22 & 0x1100) == 0x1100)) {
      pVar20 = (png_ptr->background).gray;
      pVar26 = (png_ptr->trans_color).gray;
      pVar3 = png_ptr->bit_depth;
      if (pVar3 == '\x04') {
        pVar20 = pVar20 * 0x11;
        pVar26 = pVar26 * 0x11;
      }
      else if (pVar3 == '\x02') {
        pVar20 = pVar20 * 0x55;
        pVar26 = pVar26 * 0x55;
      }
      else if (pVar3 == '\x01') {
        pVar20 = pVar20 * 0xff;
        pVar26 = pVar26 * 0xff;
      }
      (png_ptr->background).blue = pVar20;
      (png_ptr->background).green = pVar20;
      (png_ptr->background).red = pVar20;
      if ((uVar22 >> 0x19 & 1) == 0) {
        (png_ptr->trans_color).blue = pVar26;
        (png_ptr->trans_color).green = pVar26;
        (png_ptr->trans_color).red = pVar26;
      }
    }
  }
  if (((uVar22 & 0x380) == 0x280) && (png_ptr->bit_depth != '\x10')) {
    uVar30._0_2_ = (png_ptr->background).red;
    uVar30._2_2_ = (png_ptr->background).green;
    uVar30._4_2_ = (png_ptr->background).blue;
    uVar30._6_2_ = (png_ptr->background).gray;
    auVar11._8_4_ = 0;
    auVar11._0_8_ = uVar30;
    auVar11._12_2_ = uVar30._6_2_;
    auVar12._8_2_ = uVar30._4_2_;
    auVar12._0_8_ = uVar30;
    auVar12._10_4_ = auVar11._10_4_;
    auVar14._6_8_ = 0;
    auVar14._0_6_ = auVar12._8_6_;
    auVar36._0_4_ = (int)((uint)(ushort)(undefined2)uVar30 * 0xff + 0x807f) >> 0x10;
    auVar36._4_4_ = (int)CONCAT82(SUB148(auVar14 << 0x40,6),uVar30._2_2_) * 0xff + 0x807f >> 0x10;
    auVar36._8_4_ = auVar12._8_4_ * 0xff + 0x807f >> 0x10;
    auVar36._12_4_ = (int)((auVar11._10_4_ >> 0x10) * 0xff + 0x807f) >> 0x10;
    auVar36 = packssdw(auVar36,auVar36);
    uVar35 = auVar36._0_8_;
    (png_ptr->background).red = (short)uVar35;
    (png_ptr->background).green = (short)((ulong)uVar35 >> 0x10);
    (png_ptr->background).blue = (short)((ulong)uVar35 >> 0x20);
    (png_ptr->background).gray = (short)((ulong)uVar35 >> 0x30);
  }
  if (((uVar22 & 0x180) == 0x80 && (uVar22 & 0x4000400) != 0) && (png_ptr->bit_depth == '\x10')) {
    uVar29._0_2_ = (png_ptr->background).red;
    uVar29._2_2_ = (png_ptr->background).green;
    uVar29._4_2_ = (png_ptr->background).blue;
    uVar29._6_2_ = (png_ptr->background).gray;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar29;
    auVar36 = psllw(auVar34,8);
    (png_ptr->background).red = auVar36._0_2_ + (undefined2)uVar29;
    (png_ptr->background).green = auVar36._2_2_ + uVar29._2_2_;
    (png_ptr->background).blue = auVar36._4_2_ + uVar29._4_2_;
    (png_ptr->background).gray = auVar36._6_2_ + uVar29._6_2_;
  }
  (png_ptr->background_1).gray = (png_ptr->background).gray;
  uVar15 = (png_ptr->background).field_0x1;
  pVar20 = (png_ptr->background).red;
  pVar26 = (png_ptr->background).green;
  pVar16 = (png_ptr->background).blue;
  (png_ptr->background_1).index = (png_ptr->background).index;
  (png_ptr->background_1).field_0x1 = uVar15;
  (png_ptr->background_1).red = pVar20;
  (png_ptr->background_1).green = pVar26;
  (png_ptr->background_1).blue = pVar16;
  if ((uVar22 >> 0xd & 1) == 0) {
    if ((uVar22 & 0x600000) != 0) {
      iVar21 = png_gamma_significant((png_ptr->colorspace).gamma);
      if ((iVar21 != 0) || (iVar21 = png_gamma_significant(png_ptr->screen_gamma), iVar21 != 0))
      goto LAB_00114c1d;
      uVar22 = png_ptr->transformations;
    }
    if (((char)uVar22 < '\0') &&
       (((iVar21 = png_gamma_significant((png_ptr->colorspace).gamma), iVar21 != 0 ||
         (iVar21 = png_gamma_significant(png_ptr->screen_gamma), iVar21 != 0)) ||
        ((png_ptr->background_gamma_type == '\x03' &&
         (iVar21 = png_gamma_significant(png_ptr->background_gamma), iVar21 != 0))))))
    goto LAB_00114c1d;
    uVar22 = png_ptr->transformations;
    if ((uVar22 >> 0x17 & 1) != 0) {
      iVar21 = png_gamma_significant(png_ptr->screen_gamma);
      if (iVar21 != 0) goto LAB_00114c1d;
      uVar22 = png_ptr->transformations;
    }
    if ((-1 < (char)uVar22) || (png_ptr->color_type != '\x03')) goto LAB_0011517a;
    uVar4 = png_ptr->num_trans;
    if ((ulong)uVar4 != 0) {
      uVar5 = (png_ptr->background).red;
      uVar6 = (png_ptr->background).green;
      uVar7 = (png_ptr->background).blue;
      ppVar28 = &png_ptr->palette->blue;
      uVar30 = 0;
      do {
        ppVar9 = png_ptr->trans_alpha;
        bVar18 = ppVar9[uVar30];
        if (bVar18 != 0xff) {
          if (bVar18 == 0) {
            ((png_color *)(ppVar28 + -2))->red = (byte)uVar5;
            ppVar28[-1] = (byte)uVar6;
            *ppVar28 = (byte)uVar7;
          }
          else {
            uVar27 = (ushort)((png_color *)(ppVar28 + -2))->red * (ushort)bVar18 + 0x80 +
                     (ushort)(byte)~bVar18 * (uVar5 & 0xff);
            ((png_color *)(ppVar28 + -2))->red = (byte)((uint)(uVar27 >> 8) + (uint)uVar27 >> 8);
            uVar22 = (uint)ppVar28[-1] * (uint)ppVar9[uVar30] + 0x80 +
                     (ppVar9[uVar30] ^ 0xff) * (uVar6 & 0xff) & 0xffff;
            ppVar28[-1] = (byte)((uVar22 >> 8) + uVar22 >> 8);
            uVar22 = (uint)*ppVar28 * (uint)ppVar9[uVar30] + 0x80 +
                     (ppVar9[uVar30] ^ 0xff) * (uint)(uVar7 & 0xff) & 0xffff;
            *ppVar28 = (byte)((uVar22 >> 8) + uVar22 >> 8);
          }
        }
        uVar30 = uVar30 + 1;
        ppVar28 = ppVar28 + 3;
      } while (uVar4 != uVar30);
      uVar22 = png_ptr->transformations;
    }
    uVar22 = uVar22 & 0xffffff7f;
  }
  else {
LAB_00114c1d:
    png_build_gamma_table(png_ptr,(uint)png_ptr->bit_depth);
    uVar22 = png_ptr->transformations;
    if ((char)uVar22 < '\0') {
      if ((uVar22 & 0x600000) != 0) {
        png_warning(png_ptr,"libpng does not support gamma+background+rgb_to_gray");
      }
      if (png_ptr->color_type != '\x03') {
        pVar3 = png_ptr->background_gamma_type;
        if (pVar3 == '\x03') {
          pVar25 = png_reciprocal(png_ptr->background_gamma);
          a = png_ptr->background_gamma;
          pVar24 = png_ptr->screen_gamma;
LAB_00114dc6:
          pVar24 = png_reciprocal2(a,pVar24);
        }
        else {
          if (pVar3 == '\x02') {
            pVar25 = png_reciprocal((png_ptr->colorspace).gamma);
            pVar24 = png_ptr->screen_gamma;
            a = (png_ptr->colorspace).gamma;
            goto LAB_00114dc6;
          }
          if (pVar3 != '\x01') {
            png_error(png_ptr,"invalid background gamma type");
          }
          pVar25 = png_ptr->screen_gamma;
          pVar24 = 100000;
        }
        iVar21 = png_gamma_significant(pVar25);
        iVar23 = png_gamma_significant(pVar24);
        if (iVar21 != 0) {
          pVar20 = png_gamma_correct(png_ptr,(uint)(png_ptr->background).gray,pVar25);
          (png_ptr->background_1).gray = pVar20;
        }
        if (iVar23 != 0) {
          pVar20 = png_gamma_correct(png_ptr,(uint)(png_ptr->background).gray,pVar24);
          (png_ptr->background).gray = pVar20;
        }
        uVar4 = (png_ptr->background).red;
        if (((uVar4 == (png_ptr->background).green) && (uVar4 == (png_ptr->background).blue)) &&
           (uVar4 == (png_ptr->background).gray)) {
          pVar20 = (png_ptr->background_1).gray;
          (png_ptr->background_1).blue = pVar20;
          (png_ptr->background_1).green = pVar20;
          (png_ptr->background_1).red = pVar20;
          (png_ptr->background).blue = uVar4;
          (png_ptr->background).green = uVar4;
          (png_ptr->background).red = uVar4;
        }
        else {
          if (iVar21 != 0) {
            pVar20 = png_gamma_correct(png_ptr,(uint)uVar4,pVar25);
            (png_ptr->background_1).red = pVar20;
            pVar20 = png_gamma_correct(png_ptr,(uint)(png_ptr->background).green,pVar25);
            (png_ptr->background_1).green = pVar20;
            pVar20 = png_gamma_correct(png_ptr,(uint)(png_ptr->background).blue,pVar25);
            (png_ptr->background_1).blue = pVar20;
          }
          if (iVar23 != 0) {
            pVar20 = png_gamma_correct(png_ptr,(uint)(png_ptr->background).red,pVar24);
            (png_ptr->background).red = pVar20;
            pVar20 = png_gamma_correct(png_ptr,(uint)(png_ptr->background).green,pVar24);
            (png_ptr->background).green = pVar20;
            pVar20 = png_gamma_correct(png_ptr,(uint)(png_ptr->background).blue,pVar24);
            (png_ptr->background).blue = pVar20;
          }
        }
        png_ptr->background_gamma_type = '\x01';
        uVar22 = png_ptr->transformations;
        goto LAB_0011517a;
      }
      ppVar8 = png_ptr->palette;
      uVar4 = png_ptr->num_palette;
      pVar3 = png_ptr->background_gamma_type;
      pVar25 = 100000;
      if (pVar3 == '\x01') {
        pVar24 = png_ptr->screen_gamma;
LAB_00114f4b:
        iVar21 = png_gamma_significant(pVar25);
        local_38 = (uint)(png_ptr->background).red;
        if (iVar21 == 0) {
          local_39 = (byte)(png_ptr->background).green;
          local_3a = (byte)(png_ptr->background).blue;
        }
        else {
          bVar18 = png_gamma_8bit_correct(local_38,pVar25);
          local_38 = (uint)bVar18;
          local_39 = png_gamma_8bit_correct((uint)(png_ptr->background).green,pVar25);
          local_3a = png_gamma_8bit_correct((uint)(png_ptr->background).blue,pVar25);
        }
        iVar21 = png_gamma_significant(pVar24);
        uVar22 = (uint)(png_ptr->background).red;
        if (iVar21 == 0) {
          bVar18 = (byte)(png_ptr->background).green;
          bVar19 = (byte)(png_ptr->background).blue;
        }
        else {
          bVar18 = png_gamma_8bit_correct(uVar22,pVar24);
          uVar22 = (uint)bVar18;
          bVar18 = png_gamma_8bit_correct((uint)(png_ptr->background).green,pVar24);
          bVar19 = png_gamma_8bit_correct((uint)(png_ptr->background).blue,pVar24);
        }
      }
      else {
        if (pVar3 == '\x03') {
          pVar24 = png_reciprocal(png_ptr->background_gamma);
          pVar25 = png_reciprocal2(png_ptr->background_gamma,png_ptr->screen_gamma);
          goto LAB_00114f4b;
        }
        pVar24 = 100000;
        if (pVar3 != '\x02') goto LAB_00114f4b;
        uVar5 = (png_ptr->background).red;
        ppVar9 = png_ptr->gamma_table;
        ppVar33 = png_ptr->gamma_to_1;
        local_38._0_1_ = ppVar9[uVar5];
        uVar6 = (png_ptr->background).green;
        local_39 = ppVar9[uVar6];
        uVar7 = (png_ptr->background).blue;
        local_3a = ppVar9[uVar7];
        uVar22 = (uint)ppVar33[uVar5];
        bVar18 = ppVar33[uVar6];
        bVar19 = ppVar33[uVar7];
      }
      if ((ulong)uVar4 != 0) {
        ppVar28 = &ppVar8->blue;
        uVar30 = 0;
        do {
          if (uVar30 < png_ptr->num_trans) {
            ppVar9 = png_ptr->trans_alpha;
            bVar32 = ppVar9[uVar30];
            if (bVar32 == 0xff) goto LAB_0011505d;
            if (bVar32 != 0) {
              ppVar33 = png_ptr->gamma_from_1;
              ppVar10 = png_ptr->gamma_to_1;
              iVar21 = (uint)(byte)~bVar32 * (uVar22 & 0xff) +
                       (uint)ppVar10[((png_color *)(ppVar28 + -2))->red] * (uint)bVar32;
              ((png_color *)(ppVar28 + -2))->red =
                   ppVar33[iVar21 + (iVar21 + 0x80U >> 8 & 0xff) + 0x80 >> 8 & 0xff];
              iVar21 = (ppVar9[uVar30] ^ 0xff) * (uint)bVar18 +
                       (uint)ppVar10[ppVar28[-1]] * (uint)ppVar9[uVar30];
              ppVar28[-1] = ppVar33[(iVar21 + 0x80U >> 8 & 0xff) + iVar21 + 0x80 >> 8 & 0xff];
              iVar21 = (ppVar9[uVar30] ^ 0xff) * (uint)bVar19 +
                       (uint)ppVar10[*ppVar28] * (uint)ppVar9[uVar30];
              uVar29 = (ulong)(iVar21 + (iVar21 + 0x80U >> 8 & 0xff) + 0x80 >> 8 & 0xff);
              goto LAB_00115083;
            }
            ((png_color *)(ppVar28 + -2))->red = (byte)local_38;
            ppVar28[-1] = local_39;
            bVar32 = local_3a;
          }
          else {
LAB_0011505d:
            ppVar33 = png_ptr->gamma_table;
            ((png_color *)(ppVar28 + -2))->red = ppVar33[((png_color *)(ppVar28 + -2))->red];
            ppVar28[-1] = ppVar33[ppVar28[-1]];
            uVar29 = (ulong)*ppVar28;
LAB_00115083:
            bVar32 = ppVar33[uVar29];
          }
          *ppVar28 = bVar32;
          uVar30 = uVar30 + 1;
          ppVar28 = ppVar28 + 3;
        } while (uVar4 != uVar30);
      }
      uVar22 = png_ptr->transformations & 0xffffdf7f;
    }
    else {
      if ((png_ptr->color_type != '\x03') ||
         (((byte)(uVar22 >> 0xc) & (uVar22 & 0x600000) != 0) != 0)) goto LAB_0011517a;
      uVar4 = png_ptr->num_palette;
      if ((ulong)uVar4 != 0) {
        ppVar8 = png_ptr->palette;
        ppVar9 = png_ptr->gamma_table;
        lVar31 = 0;
        do {
          (&ppVar8->red)[lVar31] = ppVar9[(&ppVar8->red)[lVar31]];
          (&ppVar8->green)[lVar31] = ppVar9[(&ppVar8->green)[lVar31]];
          (&ppVar8->blue)[lVar31] = ppVar9[(&ppVar8->blue)[lVar31]];
          lVar31 = lVar31 + 3;
        } while ((ulong)uVar4 * 3 != lVar31);
      }
      uVar22 = uVar22 & 0xffffdf7f;
    }
  }
  png_ptr->transformations = uVar22;
LAB_0011517a:
  if (((uVar22 & 0x1008) == 8) && (png_ptr->color_type == '\x03')) {
    uVar4 = png_ptr->num_palette;
    uVar30 = (ulong)uVar4;
    pVar3 = (png_ptr->sig_bit).red;
    png_ptr->transformations = uVar22 & 0xffffeff7;
    if (uVar4 != 0 && (byte)(pVar3 - 1) < 7) {
      ppVar8 = png_ptr->palette;
      lVar31 = 0;
      do {
        (&ppVar8->red)[lVar31] = (&ppVar8->red)[lVar31] >> (8 - pVar3 & 0x1f);
        lVar31 = lVar31 + 3;
      } while (uVar30 * 3 != lVar31);
    }
    pVar3 = (png_ptr->sig_bit).green;
    if ((byte)(pVar3 - 1) < 7 && uVar4 != 0) {
      ppVar8 = png_ptr->palette;
      lVar31 = 0;
      do {
        (&ppVar8->green)[lVar31] = (&ppVar8->green)[lVar31] >> (8 - pVar3 & 0x1f);
        lVar31 = lVar31 + 3;
      } while (uVar30 * 3 != lVar31);
    }
    pVar3 = (png_ptr->sig_bit).blue;
    if ((byte)(pVar3 - 1) < 7 && uVar4 != 0) {
      ppVar8 = png_ptr->palette;
      lVar31 = 0;
      do {
        (&ppVar8->blue)[lVar31] = (&ppVar8->blue)[lVar31] >> (8 - pVar3 & 0x1f);
        lVar31 = lVar31 + 3;
      } while (uVar30 * 3 != lVar31);
    }
  }
  return;
}

Assistant:

void /* PRIVATE */
png_init_read_transformations(png_structrp png_ptr)
{
   png_debug(1, "in png_init_read_transformations");

   /* This internal function is called from png_read_start_row in pngrutil.c
    * and it is called before the 'rowbytes' calculation is done, so the code
    * in here can change or update the transformations flags.
    *
    * First do updates that do not depend on the details of the PNG image data
    * being processed.
    */

#ifdef PNG_READ_GAMMA_SUPPORTED
   /* Prior to 1.5.4 these tests were performed from png_set_gamma, 1.5.4 adds
    * png_set_alpha_mode and this is another source for a default file gamma so
    * the test needs to be performed later - here.  In addition prior to 1.5.4
    * the tests were repeated for the PALETTE color type here - this is no
    * longer necessary (and doesn't seem to have been necessary before.)
    */
   {
      /* The following temporary indicates if overall gamma correction is
       * required.
       */
      int gamma_correction = 0;

      if (png_ptr->colorspace.gamma != 0) /* has been set */
      {
         if (png_ptr->screen_gamma != 0) /* screen set too */
            gamma_correction = png_gamma_threshold(png_ptr->colorspace.gamma,
                png_ptr->screen_gamma);

         else
            /* Assume the output matches the input; a long time default behavior
             * of libpng, although the standard has nothing to say about this.
             */
            png_ptr->screen_gamma = png_reciprocal(png_ptr->colorspace.gamma);
      }

      else if (png_ptr->screen_gamma != 0)
         /* The converse - assume the file matches the screen, note that this
          * perhaps undesirable default can (from 1.5.4) be changed by calling
          * png_set_alpha_mode (even if the alpha handling mode isn't required
          * or isn't changed from the default.)
          */
         png_ptr->colorspace.gamma = png_reciprocal(png_ptr->screen_gamma);

      else /* neither are set */
         /* Just in case the following prevents any processing - file and screen
          * are both assumed to be linear and there is no way to introduce a
          * third gamma value other than png_set_background with 'UNIQUE', and,
          * prior to 1.5.4
          */
         png_ptr->screen_gamma = png_ptr->colorspace.gamma = PNG_FP_1;

      /* We have a gamma value now. */
      png_ptr->colorspace.flags |= PNG_COLORSPACE_HAVE_GAMMA;

      /* Now turn the gamma transformation on or off as appropriate.  Notice
       * that PNG_GAMMA just refers to the file->screen correction.  Alpha
       * composition may independently cause gamma correction because it needs
       * linear data (e.g. if the file has a gAMA chunk but the screen gamma
       * hasn't been specified.)  In any case this flag may get turned off in
       * the code immediately below if the transform can be handled outside the
       * row loop.
       */
      if (gamma_correction != 0)
         png_ptr->transformations |= PNG_GAMMA;

      else
         png_ptr->transformations &= ~PNG_GAMMA;
   }
#endif

   /* Certain transformations have the effect of preventing other
    * transformations that happen afterward in png_do_read_transformations;
    * resolve the interdependencies here.  From the code of
    * png_do_read_transformations the order is:
    *
    *  1) PNG_EXPAND (including PNG_EXPAND_tRNS)
    *  2) PNG_STRIP_ALPHA (if no compose)
    *  3) PNG_RGB_TO_GRAY
    *  4) PNG_GRAY_TO_RGB iff !PNG_BACKGROUND_IS_GRAY
    *  5) PNG_COMPOSE
    *  6) PNG_GAMMA
    *  7) PNG_STRIP_ALPHA (if compose)
    *  8) PNG_ENCODE_ALPHA
    *  9) PNG_SCALE_16_TO_8
    * 10) PNG_16_TO_8
    * 11) PNG_QUANTIZE (converts to palette)
    * 12) PNG_EXPAND_16
    * 13) PNG_GRAY_TO_RGB iff PNG_BACKGROUND_IS_GRAY
    * 14) PNG_INVERT_MONO
    * 15) PNG_INVERT_ALPHA
    * 16) PNG_SHIFT
    * 17) PNG_PACK
    * 18) PNG_BGR
    * 19) PNG_PACKSWAP
    * 20) PNG_FILLER (includes PNG_ADD_ALPHA)
    * 21) PNG_SWAP_ALPHA
    * 22) PNG_SWAP_BYTES
    * 23) PNG_USER_TRANSFORM [must be last]
    */
#ifdef PNG_READ_STRIP_ALPHA_SUPPORTED
   if ((png_ptr->transformations & PNG_STRIP_ALPHA) != 0 &&
       (png_ptr->transformations & PNG_COMPOSE) == 0)
   {
      /* Stripping the alpha channel happens immediately after the 'expand'
       * transformations, before all other transformation, so it cancels out
       * the alpha handling.  It has the side effect negating the effect of
       * PNG_EXPAND_tRNS too:
       */
      png_ptr->transformations &= ~(PNG_BACKGROUND_EXPAND | PNG_ENCODE_ALPHA |
         PNG_EXPAND_tRNS);
      png_ptr->flags &= ~PNG_FLAG_OPTIMIZE_ALPHA;

      /* Kill the tRNS chunk itself too.  Prior to 1.5.4 this did not happen
       * so transparency information would remain just so long as it wasn't
       * expanded.  This produces unexpected API changes if the set of things
       * that do PNG_EXPAND_tRNS changes (perfectly possible given the
       * documentation - which says ask for what you want, accept what you
       * get.)  This makes the behavior consistent from 1.5.4:
       */
      png_ptr->num_trans = 0;
   }
#endif /* STRIP_ALPHA supported, no COMPOSE */

#ifdef PNG_READ_ALPHA_MODE_SUPPORTED
   /* If the screen gamma is about 1.0 then the OPTIMIZE_ALPHA and ENCODE_ALPHA
    * settings will have no effect.
    */
   if (png_gamma_significant(png_ptr->screen_gamma) == 0)
   {
      png_ptr->transformations &= ~PNG_ENCODE_ALPHA;
      png_ptr->flags &= ~PNG_FLAG_OPTIMIZE_ALPHA;
   }
#endif

#ifdef PNG_READ_RGB_TO_GRAY_SUPPORTED
   /* Make sure the coefficients for the rgb to gray conversion are set
    * appropriately.
    */
   if ((png_ptr->transformations & PNG_RGB_TO_GRAY) != 0)
      png_colorspace_set_rgb_coefficients(png_ptr);
#endif

#ifdef PNG_READ_GRAY_TO_RGB_SUPPORTED
#if defined(PNG_READ_EXPAND_SUPPORTED) && defined(PNG_READ_BACKGROUND_SUPPORTED)
   /* Detect gray background and attempt to enable optimization for
    * gray --> RGB case.
    *
    * Note:  if PNG_BACKGROUND_EXPAND is set and color_type is either RGB or
    * RGB_ALPHA (in which case need_expand is superfluous anyway), the
    * background color might actually be gray yet not be flagged as such.
    * This is not a problem for the current code, which uses
    * PNG_BACKGROUND_IS_GRAY only to decide when to do the
    * png_do_gray_to_rgb() transformation.
    *
    * TODO: this code needs to be revised to avoid the complexity and
    * interdependencies.  The color type of the background should be recorded in
    * png_set_background, along with the bit depth, then the code has a record
    * of exactly what color space the background is currently in.
    */
   if ((png_ptr->transformations & PNG_BACKGROUND_EXPAND) != 0)
   {
      /* PNG_BACKGROUND_EXPAND: the background is in the file color space, so if
       * the file was grayscale the background value is gray.
       */
      if ((png_ptr->color_type & PNG_COLOR_MASK_COLOR) == 0)
         png_ptr->mode |= PNG_BACKGROUND_IS_GRAY;
   }

   else if ((png_ptr->transformations & PNG_COMPOSE) != 0)
   {
      /* PNG_COMPOSE: png_set_background was called with need_expand false,
       * so the color is in the color space of the output or png_set_alpha_mode
       * was called and the color is black.  Ignore RGB_TO_GRAY because that
       * happens before GRAY_TO_RGB.
       */
      if ((png_ptr->transformations & PNG_GRAY_TO_RGB) != 0)
      {
         if (png_ptr->background.red == png_ptr->background.green &&
             png_ptr->background.red == png_ptr->background.blue)
         {
            png_ptr->mode |= PNG_BACKGROUND_IS_GRAY;
            png_ptr->background.gray = png_ptr->background.red;
         }
      }
   }
#endif /* READ_EXPAND && READ_BACKGROUND */
#endif /* READ_GRAY_TO_RGB */

   /* For indexed PNG data (PNG_COLOR_TYPE_PALETTE) many of the transformations
    * can be performed directly on the palette, and some (such as rgb to gray)
    * can be optimized inside the palette.  This is particularly true of the
    * composite (background and alpha) stuff, which can be pretty much all done
    * in the palette even if the result is expanded to RGB or gray afterward.
    *
    * NOTE: this is Not Yet Implemented, the code behaves as in 1.5.1 and
    * earlier and the palette stuff is actually handled on the first row.  This
    * leads to the reported bug that the palette returned by png_get_PLTE is not
    * updated.
    */
   if (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE)
      png_init_palette_transformations(png_ptr);

   else
      png_init_rgb_transformations(png_ptr);

#if defined(PNG_READ_BACKGROUND_SUPPORTED) && \
   defined(PNG_READ_EXPAND_16_SUPPORTED)
   if ((png_ptr->transformations & PNG_EXPAND_16) != 0 &&
       (png_ptr->transformations & PNG_COMPOSE) != 0 &&
       (png_ptr->transformations & PNG_BACKGROUND_EXPAND) == 0 &&
       png_ptr->bit_depth != 16)
   {
      /* TODO: fix this.  Because the expand_16 operation is after the compose
       * handling the background color must be 8, not 16, bits deep, but the
       * application will supply a 16-bit value so reduce it here.
       *
       * The PNG_BACKGROUND_EXPAND code above does not expand to 16 bits at
       * present, so that case is ok (until do_expand_16 is moved.)
       *
       * NOTE: this discards the low 16 bits of the user supplied background
       * color, but until expand_16 works properly there is no choice!
       */
#     define CHOP(x) (x)=((png_uint_16)PNG_DIV257(x))
      CHOP(png_ptr->background.red);
      CHOP(png_ptr->background.green);
      CHOP(png_ptr->background.blue);
      CHOP(png_ptr->background.gray);
#     undef CHOP
   }
#endif /* READ_BACKGROUND && READ_EXPAND_16 */

#if defined(PNG_READ_BACKGROUND_SUPPORTED) && \
   (defined(PNG_READ_SCALE_16_TO_8_SUPPORTED) || \
   defined(PNG_READ_STRIP_16_TO_8_SUPPORTED))
   if ((png_ptr->transformations & (PNG_16_TO_8|PNG_SCALE_16_TO_8)) != 0 &&
       (png_ptr->transformations & PNG_COMPOSE) != 0 &&
       (png_ptr->transformations & PNG_BACKGROUND_EXPAND) == 0 &&
       png_ptr->bit_depth == 16)
   {
      /* On the other hand, if a 16-bit file is to be reduced to 8-bits per
       * component this will also happen after PNG_COMPOSE and so the background
       * color must be pre-expanded here.
       *
       * TODO: fix this too.
       */
      png_ptr->background.red = (png_uint_16)(png_ptr->background.red * 257);
      png_ptr->background.green =
         (png_uint_16)(png_ptr->background.green * 257);
      png_ptr->background.blue = (png_uint_16)(png_ptr->background.blue * 257);
      png_ptr->background.gray = (png_uint_16)(png_ptr->background.gray * 257);
   }
#endif

   /* NOTE: below 'PNG_READ_ALPHA_MODE_SUPPORTED' is presumed to also enable the
    * background support (see the comments in scripts/pnglibconf.dfa), this
    * allows pre-multiplication of the alpha channel to be implemented as
    * compositing on black.  This is probably sub-optimal and has been done in
    * 1.5.4 betas simply to enable external critique and testing (i.e. to
    * implement the new API quickly, without lots of internal changes.)
    */

#ifdef PNG_READ_GAMMA_SUPPORTED
#  ifdef PNG_READ_BACKGROUND_SUPPORTED
      /* Includes ALPHA_MODE */
      png_ptr->background_1 = png_ptr->background;
#  endif

   /* This needs to change - in the palette image case a whole set of tables are
    * built when it would be quicker to just calculate the correct value for
    * each palette entry directly.  Also, the test is too tricky - why check
    * PNG_RGB_TO_GRAY if PNG_GAMMA is not set?  The answer seems to be that
    * PNG_GAMMA is cancelled even if the gamma is known?  The test excludes the
    * PNG_COMPOSE case, so apparently if there is no *overall* gamma correction
    * the gamma tables will not be built even if composition is required on a
    * gamma encoded value.
    *
    * In 1.5.4 this is addressed below by an additional check on the individual
    * file gamma - if it is not 1.0 both RGB_TO_GRAY and COMPOSE need the
    * tables.
    */
   if ((png_ptr->transformations & PNG_GAMMA) != 0 ||
       ((png_ptr->transformations & PNG_RGB_TO_GRAY) != 0 &&
        (png_gamma_significant(png_ptr->colorspace.gamma) != 0 ||
         png_gamma_significant(png_ptr->screen_gamma) != 0)) ||
        ((png_ptr->transformations & PNG_COMPOSE) != 0 &&
         (png_gamma_significant(png_ptr->colorspace.gamma) != 0 ||
          png_gamma_significant(png_ptr->screen_gamma) != 0
#  ifdef PNG_READ_BACKGROUND_SUPPORTED
         || (png_ptr->background_gamma_type == PNG_BACKGROUND_GAMMA_UNIQUE &&
           png_gamma_significant(png_ptr->background_gamma) != 0)
#  endif
        )) || ((png_ptr->transformations & PNG_ENCODE_ALPHA) != 0 &&
       png_gamma_significant(png_ptr->screen_gamma) != 0))
   {
      png_build_gamma_table(png_ptr, png_ptr->bit_depth);

#ifdef PNG_READ_BACKGROUND_SUPPORTED
      if ((png_ptr->transformations & PNG_COMPOSE) != 0)
      {
         /* Issue a warning about this combination: because RGB_TO_GRAY is
          * optimized to do the gamma transform if present yet do_background has
          * to do the same thing if both options are set a
          * double-gamma-correction happens.  This is true in all versions of
          * libpng to date.
          */
         if ((png_ptr->transformations & PNG_RGB_TO_GRAY) != 0)
            png_warning(png_ptr,
                "libpng does not support gamma+background+rgb_to_gray");

         if ((png_ptr->color_type == PNG_COLOR_TYPE_PALETTE) != 0)
         {
            /* We don't get to here unless there is a tRNS chunk with non-opaque
             * entries - see the checking code at the start of this function.
             */
            png_color back, back_1;
            png_colorp palette = png_ptr->palette;
            int num_palette = png_ptr->num_palette;
            int i;
            if (png_ptr->background_gamma_type == PNG_BACKGROUND_GAMMA_FILE)
            {

               back.red = png_ptr->gamma_table[png_ptr->background.red];
               back.green = png_ptr->gamma_table[png_ptr->background.green];
               back.blue = png_ptr->gamma_table[png_ptr->background.blue];

               back_1.red = png_ptr->gamma_to_1[png_ptr->background.red];
               back_1.green = png_ptr->gamma_to_1[png_ptr->background.green];
               back_1.blue = png_ptr->gamma_to_1[png_ptr->background.blue];
            }
            else
            {
               png_fixed_point g, gs;

               switch (png_ptr->background_gamma_type)
               {
                  case PNG_BACKGROUND_GAMMA_SCREEN:
                     g = (png_ptr->screen_gamma);
                     gs = PNG_FP_1;
                     break;

                  case PNG_BACKGROUND_GAMMA_FILE:
                     g = png_reciprocal(png_ptr->colorspace.gamma);
                     gs = png_reciprocal2(png_ptr->colorspace.gamma,
                         png_ptr->screen_gamma);
                     break;

                  case PNG_BACKGROUND_GAMMA_UNIQUE:
                     g = png_reciprocal(png_ptr->background_gamma);
                     gs = png_reciprocal2(png_ptr->background_gamma,
                         png_ptr->screen_gamma);
                     break;
                  default:
                     g = PNG_FP_1;    /* back_1 */
                     gs = PNG_FP_1;   /* back */
                     break;
               }

               if (png_gamma_significant(gs) != 0)
               {
                  back.red = png_gamma_8bit_correct(png_ptr->background.red,
                      gs);
                  back.green = png_gamma_8bit_correct(png_ptr->background.green,
                      gs);
                  back.blue = png_gamma_8bit_correct(png_ptr->background.blue,
                      gs);
               }

               else
               {
                  back.red   = (png_byte)png_ptr->background.red;
                  back.green = (png_byte)png_ptr->background.green;
                  back.blue  = (png_byte)png_ptr->background.blue;
               }

               if (png_gamma_significant(g) != 0)
               {
                  back_1.red = png_gamma_8bit_correct(png_ptr->background.red,
                      g);
                  back_1.green = png_gamma_8bit_correct(
                      png_ptr->background.green, g);
                  back_1.blue = png_gamma_8bit_correct(png_ptr->background.blue,
                      g);
               }

               else
               {
                  back_1.red   = (png_byte)png_ptr->background.red;
                  back_1.green = (png_byte)png_ptr->background.green;
                  back_1.blue  = (png_byte)png_ptr->background.blue;
               }
            }

            for (i = 0; i < num_palette; i++)
            {
               if (i < (int)png_ptr->num_trans &&
                   png_ptr->trans_alpha[i] != 0xff)
               {
                  if (png_ptr->trans_alpha[i] == 0)
                  {
                     palette[i] = back;
                  }
                  else /* if (png_ptr->trans_alpha[i] != 0xff) */
                  {
                     png_byte v, w;

                     v = png_ptr->gamma_to_1[palette[i].red];
                     png_composite(w, v, png_ptr->trans_alpha[i], back_1.red);
                     palette[i].red = png_ptr->gamma_from_1[w];

                     v = png_ptr->gamma_to_1[palette[i].green];
                     png_composite(w, v, png_ptr->trans_alpha[i], back_1.green);
                     palette[i].green = png_ptr->gamma_from_1[w];

                     v = png_ptr->gamma_to_1[palette[i].blue];
                     png_composite(w, v, png_ptr->trans_alpha[i], back_1.blue);
                     palette[i].blue = png_ptr->gamma_from_1[w];
                  }
               }
               else
               {
                  palette[i].red = png_ptr->gamma_table[palette[i].red];
                  palette[i].green = png_ptr->gamma_table[palette[i].green];
                  palette[i].blue = png_ptr->gamma_table[palette[i].blue];
               }
            }

            /* Prevent the transformations being done again.
             *
             * NOTE: this is highly dubious; it removes the transformations in
             * place.  This seems inconsistent with the general treatment of the
             * transformations elsewhere.
             */
            png_ptr->transformations &= ~(PNG_COMPOSE | PNG_GAMMA);
         } /* color_type == PNG_COLOR_TYPE_PALETTE */

         /* if (png_ptr->background_gamma_type!=PNG_BACKGROUND_GAMMA_UNKNOWN) */
         else /* color_type != PNG_COLOR_TYPE_PALETTE */
         {
            int gs_sig, g_sig;
            png_fixed_point g = PNG_FP_1;  /* Correction to linear */
            png_fixed_point gs = PNG_FP_1; /* Correction to screen */

            switch (png_ptr->background_gamma_type)
            {
               case PNG_BACKGROUND_GAMMA_SCREEN:
                  g = png_ptr->screen_gamma;
                  /* gs = PNG_FP_1; */
                  break;

               case PNG_BACKGROUND_GAMMA_FILE:
                  g = png_reciprocal(png_ptr->colorspace.gamma);
                  gs = png_reciprocal2(png_ptr->colorspace.gamma,
                      png_ptr->screen_gamma);
                  break;

               case PNG_BACKGROUND_GAMMA_UNIQUE:
                  g = png_reciprocal(png_ptr->background_gamma);
                  gs = png_reciprocal2(png_ptr->background_gamma,
                      png_ptr->screen_gamma);
                  break;

               default:
                  png_error(png_ptr, "invalid background gamma type");
            }

            g_sig = png_gamma_significant(g);
            gs_sig = png_gamma_significant(gs);

            if (g_sig != 0)
               png_ptr->background_1.gray = png_gamma_correct(png_ptr,
                   png_ptr->background.gray, g);

            if (gs_sig != 0)
               png_ptr->background.gray = png_gamma_correct(png_ptr,
                   png_ptr->background.gray, gs);

            if ((png_ptr->background.red != png_ptr->background.green) ||
                (png_ptr->background.red != png_ptr->background.blue) ||
                (png_ptr->background.red != png_ptr->background.gray))
            {
               /* RGB or RGBA with color background */
               if (g_sig != 0)
               {
                  png_ptr->background_1.red = png_gamma_correct(png_ptr,
                      png_ptr->background.red, g);

                  png_ptr->background_1.green = png_gamma_correct(png_ptr,
                      png_ptr->background.green, g);

                  png_ptr->background_1.blue = png_gamma_correct(png_ptr,
                      png_ptr->background.blue, g);
               }

               if (gs_sig != 0)
               {
                  png_ptr->background.red = png_gamma_correct(png_ptr,
                      png_ptr->background.red, gs);

                  png_ptr->background.green = png_gamma_correct(png_ptr,
                      png_ptr->background.green, gs);

                  png_ptr->background.blue = png_gamma_correct(png_ptr,
                      png_ptr->background.blue, gs);
               }
            }

            else
            {
               /* GRAY, GRAY ALPHA, RGB, or RGBA with gray background */
               png_ptr->background_1.red = png_ptr->background_1.green
                   = png_ptr->background_1.blue = png_ptr->background_1.gray;

               png_ptr->background.red = png_ptr->background.green
                   = png_ptr->background.blue = png_ptr->background.gray;
            }

            /* The background is now in screen gamma: */
            png_ptr->background_gamma_type = PNG_BACKGROUND_GAMMA_SCREEN;
         } /* color_type != PNG_COLOR_TYPE_PALETTE */
      }/* png_ptr->transformations & PNG_BACKGROUND */

      else
      /* Transformation does not include PNG_BACKGROUND */
#endif /* READ_BACKGROUND */
      if (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE
#ifdef PNG_READ_RGB_TO_GRAY_SUPPORTED
         /* RGB_TO_GRAY needs to have non-gamma-corrected values! */
         && ((png_ptr->transformations & PNG_EXPAND) == 0 ||
         (png_ptr->transformations & PNG_RGB_TO_GRAY) == 0)
#endif
         )
      {
         png_colorp palette = png_ptr->palette;
         int num_palette = png_ptr->num_palette;
         int i;

         /* NOTE: there are other transformations that should probably be in
          * here too.
          */
         for (i = 0; i < num_palette; i++)
         {
            palette[i].red = png_ptr->gamma_table[palette[i].red];
            palette[i].green = png_ptr->gamma_table[palette[i].green];
            palette[i].blue = png_ptr->gamma_table[palette[i].blue];
         }

         /* Done the gamma correction. */
         png_ptr->transformations &= ~PNG_GAMMA;
      } /* color_type == PALETTE && !PNG_BACKGROUND transformation */
   }
#ifdef PNG_READ_BACKGROUND_SUPPORTED
   else
#endif
#endif /* READ_GAMMA */

#ifdef PNG_READ_BACKGROUND_SUPPORTED
   /* No GAMMA transformation (see the hanging else 4 lines above) */
   if ((png_ptr->transformations & PNG_COMPOSE) != 0 &&
       (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE))
   {
      int i;
      int istop = (int)png_ptr->num_trans;
      png_color back;
      png_colorp palette = png_ptr->palette;

      back.red   = (png_byte)png_ptr->background.red;
      back.green = (png_byte)png_ptr->background.green;
      back.blue  = (png_byte)png_ptr->background.blue;

      for (i = 0; i < istop; i++)
      {
         if (png_ptr->trans_alpha[i] == 0)
         {
            palette[i] = back;
         }

         else if (png_ptr->trans_alpha[i] != 0xff)
         {
            /* The png_composite() macro is defined in png.h */
            png_composite(palette[i].red, palette[i].red,
                png_ptr->trans_alpha[i], back.red);

            png_composite(palette[i].green, palette[i].green,
                png_ptr->trans_alpha[i], back.green);

            png_composite(palette[i].blue, palette[i].blue,
                png_ptr->trans_alpha[i], back.blue);
         }
      }

      png_ptr->transformations &= ~PNG_COMPOSE;
   }
#endif /* READ_BACKGROUND */

#ifdef PNG_READ_SHIFT_SUPPORTED
   if ((png_ptr->transformations & PNG_SHIFT) != 0 &&
       (png_ptr->transformations & PNG_EXPAND) == 0 &&
       (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE))
   {
      int i;
      int istop = png_ptr->num_palette;
      int shift = 8 - png_ptr->sig_bit.red;

      png_ptr->transformations &= ~PNG_SHIFT;

      /* significant bits can be in the range 1 to 7 for a meaningful result, if
       * the number of significant bits is 0 then no shift is done (this is an
       * error condition which is silently ignored.)
       */
      if (shift > 0 && shift < 8)
         for (i=0; i<istop; ++i)
         {
            int component = png_ptr->palette[i].red;

            component >>= shift;
            png_ptr->palette[i].red = (png_byte)component;
         }

      shift = 8 - png_ptr->sig_bit.green;
      if (shift > 0 && shift < 8)
         for (i=0; i<istop; ++i)
         {
            int component = png_ptr->palette[i].green;

            component >>= shift;
            png_ptr->palette[i].green = (png_byte)component;
         }

      shift = 8 - png_ptr->sig_bit.blue;
      if (shift > 0 && shift < 8)
         for (i=0; i<istop; ++i)
         {
            int component = png_ptr->palette[i].blue;

            component >>= shift;
            png_ptr->palette[i].blue = (png_byte)component;
         }
   }
#endif /* READ_SHIFT */
}